

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall luna::Lexer::LexStringChar(Lexer *this)

{
  String *pSVar1;
  int iVar2;
  LexException *this_00;
  anon_union_16_2_eed97686_for_String_2 *paVar3;
  char *__nptr;
  int i;
  long lVar4;
  char hex [3];
  char oct [4];
  char local_20 [4];
  char local_1c [4];
  
  if (this->current_ != 0x5c) goto LAB_0014c776;
  iVar2 = Next(this);
  this->current_ = iVar2;
  if (0x61 < iVar2) {
    switch(iVar2) {
    case 0x6e:
      break;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x76:
      break;
    case 0x78:
      iVar2 = Next(this);
      this->current_ = iVar2;
      local_20[2] = 0;
      local_20[0] = '\0';
      local_20[1] = '\0';
      lVar4 = 0;
      do {
        iVar2 = this->current_;
        if ((9 < iVar2 - 0x30U) &&
           ((0x25 < iVar2 - 0x41U || ((0x3f0000003fU >> ((ulong)(iVar2 - 0x41U) & 0x3f) & 1) == 0)))
           ) goto LAB_0014c897;
        local_20[lVar4] = (char)iVar2;
        lVar4 = lVar4 + 1;
        iVar2 = Next(this);
        this->current_ = iVar2;
      } while (lVar4 == 1);
      lVar4 = 1;
LAB_0014c897:
      if ((int)lVar4 == 0) {
        this_00 = (LexException *)__cxa_allocate_exception(0x20);
        pSVar1 = this->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          paVar3 = &pSVar1->field_1;
        }
        else {
          paVar3 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        LexException::LexException<char_const(&)[30]>
                  (this_00,paVar3->str_buffer_,this->line_,this->column_,
                   (char (*) [30])"unexpect character after \'\\x\'");
        goto LAB_0014c967;
      }
      __nptr = local_20;
      iVar2 = 0x10;
      goto LAB_0014c8ac;
    default:
      if ((iVar2 == 0x62) || (iVar2 == 0x66)) break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_0014c762_caseD_6f:
      if (9 < iVar2 - 0x30U) {
        this_00 = (LexException *)__cxa_allocate_exception(0x20);
        pSVar1 = this->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          paVar3 = &pSVar1->field_1;
        }
        else {
          paVar3 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        LexException::LexException<char_const(&)[29]>
                  (this_00,paVar3->str_buffer_,this->line_,this->column_,
                   (char (*) [29])"unexpect character after \'\\\'");
LAB_0014c967:
        __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
      }
      local_1c[0] = '\0';
      local_1c[1] = '\0';
      local_1c[2] = '\0';
      local_1c[3] = '\0';
      lVar4 = 0;
      do {
        if (9 < this->current_ - 0x30U) break;
        local_1c[lVar4] = (char)this->current_;
        lVar4 = lVar4 + 1;
        iVar2 = Next(this);
        this->current_ = iVar2;
      } while (lVar4 != 3);
      __nptr = local_1c;
      iVar2 = 8;
LAB_0014c8ac:
      strtoul(__nptr,(char **)0x0,iVar2);
      std::__cxx11::string::push_back((char)this + '@');
      return;
    }
LAB_0014c776:
    std::__cxx11::string::push_back((char)this + '@');
    iVar2 = Next(this);
    this->current_ = iVar2;
    return;
  }
  if (iVar2 < 0x5c) {
    if ((iVar2 == 0x22) || (iVar2 == 0x27)) goto LAB_0014c776;
  }
  else if ((iVar2 == 0x5c) || (iVar2 == 0x61)) goto LAB_0014c776;
  goto switchD_0014c762_caseD_6f;
}

Assistant:

void Lexer::LexStringChar()
    {
        if (current_ == '\\')
        {
            current_ = Next();
            if (current_ == 'a')
                token_buffer_.push_back('\a');
            else if (current_ == 'b')
                token_buffer_.push_back('\b');
            else if (current_ == 'f')
                token_buffer_.push_back('\f');
            else if (current_ == 'n')
                token_buffer_.push_back('\n');
            else if (current_ == 'r')
                token_buffer_.push_back('\r');
            else if (current_ == 't')
                token_buffer_.push_back('\t');
            else if (current_ == 'v')
                token_buffer_.push_back('\v');
            else if (current_ == '\\')
                token_buffer_.push_back('\\');
            else if (current_ == '"')
                token_buffer_.push_back('"');
            else if (current_ == '\'')
                token_buffer_.push_back('\'');
            else if (current_ == 'x')
            {
                current_ = Next();
                char hex[3] = { 0 };
                int i = 0;
                for (; i < 2 && IsHexChar(current_); ++i, current_ = Next())
                    hex[i] = current_;
                if (i == 0)
                    throw LexException(module_->GetCStr(), line_, column_,
                            "unexpect character after '\\x'");
                token_buffer_.push_back(static_cast<char>(strtoul(hex, 0, 16)));
                return ;
            }
            else if (isdigit(current_))
            {
                char oct[4] = { 0 };
                for (int i = 0; i < 3 && isdigit(current_); ++i, current_ = Next())
                    oct[i] = current_;
                token_buffer_.push_back(static_cast<char>(strtoul(oct, 0, 8)));
                return ;
            }
            else
                throw LexException(module_->GetCStr(), line_, column_,
                        "unexpect character after '\\'");
        }
        else
        {
            token_buffer_.push_back(current_);
        }

        current_ = Next();
    }